

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O0

bool __thiscall BGParseManager::DiscardParseResults(BGParseManager *this,DWORD cookie,void *buffer)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  BGParseWorkItem *this_00;
  byte *pbVar4;
  undefined4 *puVar5;
  Tick local_38;
  Tick now;
  bool callerOwnsSourceBuffer;
  BGParseWorkItem *workitem;
  void *buffer_local;
  DWORD cookie_local;
  BGParseManager *this_local;
  
  this_00 = FindJob(this,cookie,false,true);
  now.m_luTick._7_1_ = 1;
  if (this_00 != (BGParseWorkItem *)0x0) {
    pbVar4 = BGParseWorkItem::GetScriptSrc(this_00);
    if ((byte *)buffer != pbVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                         ,0x13c,"(buffer == workitem->GetScriptSrc())",
                         "buffer == workitem->GetScriptSrc()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = BGParseWorkItem::IsDiscarded(this_00);
    if (bVar2) {
      now.m_luTick._7_1_ = 0;
    }
    else {
      Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,BGParseWorkItem>
                (&Memory::HeapAllocator::Instance,this_00);
    }
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BgParsePhase);
  if (bVar2) {
    local_38 = Js::Tick::Now();
    DVar3 = GetCurrentThreadId();
    Js::Tick::ToMilliseconds(&local_38);
    Output::Print(L"[BgParse: Discard -- cookie: %04d on thread 0x%X at %.2f ms, workitem: 0x%p, workitem owns buffer: %u]\n"
                  ,(ulong)cookie,(ulong)DVar3,this_00,(ulong)((now.m_luTick._7_1_ ^ 0xff) & 1));
  }
  return (bool)(now.m_luTick._7_1_ & 1);
}

Assistant:

bool BGParseManager::DiscardParseResults(DWORD cookie, void* buffer)
{
    BGParseWorkItem* workitem = FindJob(cookie, false /*waitForResults*/, true /*removeJob*/);
    bool callerOwnsSourceBuffer = true;
    if (workitem != nullptr)
    {
        Assert(buffer == workitem->GetScriptSrc());

        if (!workitem->IsDiscarded())
        {
            HeapDelete(workitem);
        }
        else
        {
            callerOwnsSourceBuffer = false;
        }
    }

    if (PHASE_TRACE1(Js::BgParsePhase))
    {
        Js::Tick now = Js::Tick::Now();
        Output::Print(
            _u("[BgParse: Discard -- cookie: %04d on thread 0x%X at %.2f ms, workitem: 0x%p, workitem owns buffer: %u]\n"),
            cookie,
            ::GetCurrentThreadId(),
            now.ToMilliseconds(),
            workitem,
            !callerOwnsSourceBuffer
        );
    }

    return callerOwnsSourceBuffer;
}